

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_insert_success_beyondEndIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_90;
  char *pcStack_88;
  char *pcStack_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined8 uStack_60;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 5;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 8;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_60 = 0x10ee49;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,8);
  builtin_strncpy(array.buffer,"01234",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  c = '\0';
  uStack_60 = 0x10ee82;
  bVar1 = private_ACUtils_ADynArray_insertArray(&array,0x29a,&c,1,1);
  if (bVar1 == true) {
    uStack_60 = 0x10ee9c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x29a);
    if (array.size == 6) {
      uStack_60 = 0x10eebc;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x29b);
      if (array.capacity == 8) {
        uStack_60 = 0x10eedc;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x29c);
        if (array.buffer == (char *)0x0) {
          ppcVar6 = &local_68;
          pcVar4 = "Assertion \'_ck_x != NULL\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %#x";
          pcVar7 = "(void*) array.buffer != NULL";
          pcVar8 = "(void*) array.buffer";
          iVar2 = 0x29d;
LAB_0010f1b5:
          uStack_60 = 0;
          local_68 = (char *)0x0;
          *(code **)((long)ppcVar6 + -8) = test_ADynArray_insert_success_bufferExpanded_fn;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,pcVar4,pcVar3,pcVar7,pcVar8);
        }
        uStack_60 = 0x10eef9;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x29d);
        if ((char *)(long)array.buffer[5] != (char *)0x0) {
          ppcVar6 = &local_78;
          local_70 = "\'\\0\'";
          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
          pcVar7 = "array.buffer[5] == \'\\0\'";
          pcVar8 = "array.buffer[5]";
          iVar2 = 0x29e;
          local_78 = (char *)(long)array.buffer[5];
          goto LAB_0010f1b5;
        }
        uStack_60 = 0x10ef1d;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x29e);
        pcStack_90 = array.buffer;
        if (array.buffer == (char *)0x0) {
          pcVar3 = "";
          pcStack_90 = "(null)";
        }
        else {
          uStack_60 = 0x10ef3a;
          iVar2 = strcmp("01234",array.buffer);
          if (iVar2 == 0) {
            uStack_60 = 0x10ef53;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x29f);
            if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
              ppcVar6 = &local_68;
              pcVar4 = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar7 = "(void*) array.growStrategy != NULL";
              pcVar8 = "(void*) array.growStrategy";
              iVar2 = 0x2a0;
            }
            else {
              uStack_60 = 0x10ef70;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x2a0);
              if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
                uStack_60 = 0x10ef91;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x2a1);
                uStack_60 = 0x10ef9a;
                (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
                return;
              }
              ppcVar6 = &local_78;
              local_70 = "0";
              local_78 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
              pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 0";
              pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount";
              iVar2 = 0x2a1;
            }
            goto LAB_0010f1b5;
          }
          pcVar3 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar4 = "array.buffer == \"01234\"";
        pcVar7 = "array.buffer";
        iVar2 = 0x29f;
        local_68 = "\"";
        local_70 = "01234";
        local_78 = "\"";
        pcStack_80 = "\"01234\"";
        ppcVar5 = &pcStack_90;
        pcStack_88 = pcVar3;
        goto LAB_0010f135;
      }
      local_70 = "8";
      pcVar4 = "array.capacity == 8";
      pcVar7 = "array.capacity";
      iVar2 = 0x29c;
      local_68 = (char *)0x8;
      pcVar3 = (char *)array.capacity;
    }
    else {
      local_70 = "6";
      pcVar4 = "array.size == 6";
      pcVar7 = "array.size";
      iVar2 = 0x29b;
      local_68 = (char *)0x6;
      pcVar3 = (char *)array.size;
    }
  }
  else {
    pcVar3 = (char *)(ulong)bVar1;
    local_70 = "true";
    pcVar4 = 
    "private_ACUtils_ADynArray_insertArray(&array, 666, &(c), 1, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar7 = 
    "private_ACUtils_ADynArray_insertArray(&array, 666, &(c), 1, sizeof(*(&array)->buffer))";
    iVar2 = 0x29a;
    local_68 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &local_70;
LAB_0010f135:
  uStack_60 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x10f13c;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar8,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insert_success_beyondEndIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insert(&array, 666, c), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 6);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_INT_EQ(array.buffer[5], '\0');
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    array.deallocator(array.buffer);
}